

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  RTCIntersectArguments *pRVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  uint uVar20;
  long lVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar32 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined4 uVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  uint uVar66;
  uint uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_25ec;
  ulong local_25e8;
  ulong *local_25e0;
  RayHit *local_25d8;
  long local_25d0;
  RayQueryContext *local_25c8;
  Scene *local_25c0;
  Geometry *local_25b8;
  long local_25b0;
  RTCFilterFunctionNArguments local_25a8;
  float local_2578;
  undefined4 local_2574;
  undefined4 local_2570;
  undefined4 local_256c;
  undefined4 local_2568;
  undefined4 local_2564;
  uint local_2560;
  uint local_255c;
  uint local_2558;
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  byte local_24d7;
  float local_24c8 [4];
  float local_24b8 [4];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined8 local_2468;
  undefined8 uStack_2460;
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_25c8 = context;
    local_25e0 = local_2368;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar32 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar30._8_4_ = 0x7fffffff;
    auVar30._0_8_ = 0x7fffffff7fffffff;
    auVar30._12_4_ = 0x7fffffff;
    auVar30 = vandps_avx512vl((undefined1  [16])aVar2,auVar30);
    auVar42._8_4_ = 0x219392ef;
    auVar42._0_8_ = 0x219392ef219392ef;
    auVar42._12_4_ = 0x219392ef;
    uVar27 = vcmpps_avx512vl(auVar30,auVar42,1);
    bVar11 = (bool)((byte)uVar27 & 1);
    auVar43._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * (int)aVar2.x;
    bVar11 = (bool)((byte)(uVar27 >> 1) & 1);
    auVar43._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * (int)aVar2.y;
    bVar11 = (bool)((byte)(uVar27 >> 2) & 1);
    auVar43._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * (int)aVar2.z;
    bVar11 = (bool)((byte)(uVar27 >> 3) & 1);
    auVar43._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * aVar2.field_3.a;
    auVar30 = vrcp14ps_avx512vl(auVar43);
    auVar31._8_4_ = 0x3f800000;
    auVar31._0_8_ = 0x3f8000003f800000;
    auVar31._12_4_ = 0x3f800000;
    auVar31 = vfnmadd213ps_avx512vl(auVar43,auVar30,auVar31);
    local_2370[0] = 0;
    auVar43 = vfmadd132ps_fma(auVar31,auVar30,auVar30);
    auVar47 = vbroadcastss_avx512vl(auVar43);
    auVar69 = ZEXT3264(auVar47);
    auVar30 = vmovshdup_avx(auVar43);
    auVar47 = vbroadcastsd_avx512vl(auVar30);
    auVar70 = ZEXT3264(auVar47);
    auVar31 = vshufpd_avx(auVar43,auVar43,1);
    auVar51._8_4_ = 2;
    auVar51._0_8_ = 0x200000002;
    auVar51._12_4_ = 2;
    auVar51._16_4_ = 2;
    auVar51._20_4_ = 2;
    auVar51._24_4_ = 2;
    auVar51._28_4_ = 2;
    auVar47 = vpermps_avx512vl(auVar51,ZEXT1632(auVar43));
    auVar71 = ZEXT3264(auVar47);
    fVar56 = auVar43._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar54._4_4_ = fVar56;
    auVar54._0_4_ = fVar56;
    auVar54._8_4_ = fVar56;
    auVar54._12_4_ = fVar56;
    auVar54._16_4_ = fVar56;
    auVar54._20_4_ = fVar56;
    auVar54._24_4_ = fVar56;
    auVar54._28_4_ = fVar56;
    auVar47 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar72 = ZEXT3264(auVar47);
    auVar49 = ZEXT1632(CONCAT412(auVar43._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar43._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar43._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar56))
                                ));
    auVar48 = vpermps_avx512vl(auVar47,auVar49);
    auVar47 = vpermps_avx2(auVar51,auVar49);
    local_25e8 = (ulong)(auVar43._0_4_ < 0.0) << 5;
    uVar27 = (ulong)(auVar30._0_4_ < 0.0) << 5 | 0x40;
    uVar29 = (ulong)(auVar31._0_4_ < 0.0) << 5 | 0x80;
    uVar28 = local_25e8 ^ 0x20;
    uVar60 = auVar44._0_4_;
    auVar59 = ZEXT3264(CONCAT428(uVar60,CONCAT424(uVar60,CONCAT420(uVar60,CONCAT416(uVar60,CONCAT412
                                                  (uVar60,CONCAT48(uVar60,CONCAT44(uVar60,uVar60))))
                                                  ))));
    auVar50._8_4_ = 0x80000000;
    auVar50._0_8_ = 0x8000000080000000;
    auVar50._12_4_ = 0x80000000;
    auVar50._16_4_ = 0x80000000;
    auVar50._20_4_ = 0x80000000;
    auVar50._24_4_ = 0x80000000;
    auVar50._28_4_ = 0x80000000;
    auVar49 = vxorps_avx512vl(auVar54,auVar50);
    auVar73 = ZEXT3264(auVar49);
    auVar48 = vxorps_avx512vl(auVar48,auVar50);
    auVar74 = ZEXT3264(auVar48);
    auVar47 = vxorps_avx512vl(auVar47,auVar50);
    auVar75 = ZEXT3264(auVar47);
    auVar47 = vbroadcastss_avx512vl(auVar32);
    auVar76 = ZEXT3264(auVar47);
    auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar77 = ZEXT3264(auVar47);
    auVar47 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar78 = ZEXT3264(auVar47);
    auVar32 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar79 = ZEXT1664(auVar32);
    auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar80 = ZEXT3264(auVar47);
    local_25d8 = ray;
    do {
      pfVar6 = (float *)(local_25e0 + -1);
      local_25e0 = local_25e0 + -2;
      if (*pfVar6 <= (local_25d8->super_RayK<1>).tfar) {
        uVar26 = *local_25e0;
        while ((uVar26 & 8) == 0) {
          auVar47 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar26 + 0x40 + local_25e8),auVar73._0_32_,
                               auVar69._0_32_);
          auVar48 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar27),auVar74._0_32_,
                               auVar70._0_32_);
          auVar47 = vpmaxsd_avx2(auVar47,auVar48);
          auVar48 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar29),auVar75._0_32_,
                               auVar71._0_32_);
          auVar48 = vpmaxsd_avx512vl(auVar48,auVar76._0_32_);
          auVar47 = vpmaxsd_avx2(auVar47,auVar48);
          auVar48 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar26 + 0x40 + uVar28),auVar73._0_32_,
                               auVar69._0_32_);
          auVar49 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar27 ^ 0x20)),
                               auVar74._0_32_,auVar70._0_32_);
          auVar48 = vpminsd_avx2(auVar48,auVar49);
          auVar49 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar29 ^ 0x20)),
                               auVar75._0_32_,auVar71._0_32_);
          auVar49 = vpminsd_avx2(auVar49,auVar59._0_32_);
          auVar48 = vpminsd_avx2(auVar48,auVar49);
          uVar25 = vpcmpd_avx512vl(auVar47,auVar48,2);
          bVar19 = (byte)uVar25;
          if (bVar19 == 0) goto LAB_01f18b7d;
          auVar48 = *(undefined1 (*) [32])(uVar26 & 0xfffffffffffffff0);
          auVar49 = ((undefined1 (*) [32])(uVar26 & 0xfffffffffffffff0))[1];
          auVar50 = vmovdqa64_avx512vl(auVar77._0_32_);
          auVar50 = vpternlogd_avx512vl(auVar50,auVar47,auVar78._0_32_,0xf8);
          auVar51 = vpcompressd_avx512vl(auVar50);
          auVar53._0_4_ =
               (uint)(bVar19 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar50._0_4_;
          bVar11 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar53._4_4_ = (uint)bVar11 * auVar51._4_4_ | (uint)!bVar11 * auVar50._4_4_;
          bVar11 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar53._8_4_ = (uint)bVar11 * auVar51._8_4_ | (uint)!bVar11 * auVar50._8_4_;
          bVar11 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar53._12_4_ = (uint)bVar11 * auVar51._12_4_ | (uint)!bVar11 * auVar50._12_4_;
          bVar11 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar53._16_4_ = (uint)bVar11 * auVar51._16_4_ | (uint)!bVar11 * auVar50._16_4_;
          bVar11 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar53._20_4_ = (uint)bVar11 * auVar51._20_4_ | (uint)!bVar11 * auVar50._20_4_;
          bVar11 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar53._24_4_ = (uint)bVar11 * auVar51._24_4_ | (uint)!bVar11 * auVar50._24_4_;
          bVar11 = SUB81(uVar25 >> 7,0);
          auVar53._28_4_ = (uint)bVar11 * auVar51._28_4_ | (uint)!bVar11 * auVar50._28_4_;
          auVar50 = vpermt2q_avx512vl(auVar48,auVar53,auVar49);
          uVar26 = auVar50._0_8_;
          bVar19 = bVar19 - 1 & bVar19;
          if (bVar19 != 0) {
            auVar50 = vpshufd_avx2(auVar53,0x55);
            vpermt2q_avx512vl(auVar48,auVar50,auVar49);
            auVar51 = vpminsd_avx2(auVar53,auVar50);
            auVar50 = vpmaxsd_avx2(auVar53,auVar50);
            bVar19 = bVar19 - 1 & bVar19;
            if (bVar19 == 0) {
              auVar51 = vpermi2q_avx512vl(auVar51,auVar48,auVar49);
              uVar26 = auVar51._0_8_;
              auVar48 = vpermt2q_avx512vl(auVar48,auVar50,auVar49);
              *local_25e0 = auVar48._0_8_;
              auVar47 = vpermd_avx2(auVar50,auVar47);
              *(int *)(local_25e0 + 1) = auVar47._0_4_;
              local_25e0 = local_25e0 + 2;
            }
            else {
              auVar55 = vpshufd_avx2(auVar53,0xaa);
              vpermt2q_avx512vl(auVar48,auVar55,auVar49);
              auVar54 = vpminsd_avx2(auVar51,auVar55);
              auVar51 = vpmaxsd_avx2(auVar51,auVar55);
              auVar55 = vpminsd_avx2(auVar50,auVar51);
              auVar50 = vpmaxsd_avx2(auVar50,auVar51);
              bVar19 = bVar19 - 1 & bVar19;
              if (bVar19 == 0) {
                auVar51 = vpermi2q_avx512vl(auVar54,auVar48,auVar49);
                uVar26 = auVar51._0_8_;
                auVar51 = vpermt2q_avx512vl(auVar48,auVar50,auVar49);
                *local_25e0 = auVar51._0_8_;
                auVar50 = vpermd_avx2(auVar50,auVar47);
                *(int *)(local_25e0 + 1) = auVar50._0_4_;
                auVar48 = vpermt2q_avx512vl(auVar48,auVar55,auVar49);
                local_25e0[2] = auVar48._0_8_;
                auVar47 = vpermd_avx2(auVar55,auVar47);
                *(int *)(local_25e0 + 3) = auVar47._0_4_;
                local_25e0 = local_25e0 + 4;
              }
              else {
                auVar51 = vpshufd_avx2(auVar53,0xff);
                vpermt2q_avx512vl(auVar48,auVar51,auVar49);
                auVar12 = vpminsd_avx2(auVar54,auVar51);
                auVar51 = vpmaxsd_avx2(auVar54,auVar51);
                auVar54 = vpminsd_avx2(auVar55,auVar51);
                auVar51 = vpmaxsd_avx2(auVar55,auVar51);
                auVar55 = vpminsd_avx2(auVar50,auVar51);
                auVar50 = vpmaxsd_avx2(auVar50,auVar51);
                bVar19 = bVar19 - 1 & bVar19;
                if (bVar19 == 0) {
                  auVar51 = vpermi2q_avx512vl(auVar12,auVar48,auVar49);
                  uVar26 = auVar51._0_8_;
                  auVar51 = vpermt2q_avx512vl(auVar48,auVar50,auVar49);
                  *local_25e0 = auVar51._0_8_;
                  auVar50 = vpermd_avx2(auVar50,auVar47);
                  *(int *)(local_25e0 + 1) = auVar50._0_4_;
                  auVar50 = vpermt2q_avx512vl(auVar48,auVar55,auVar49);
                  local_25e0[2] = auVar50._0_8_;
                  auVar50 = vpermd_avx2(auVar55,auVar47);
                  *(int *)(local_25e0 + 3) = auVar50._0_4_;
                  auVar48 = vpermt2q_avx512vl(auVar48,auVar54,auVar49);
                  local_25e0[4] = auVar48._0_8_;
                  auVar47 = vpermd_avx2(auVar54,auVar47);
                  *(int *)(local_25e0 + 5) = auVar47._0_4_;
                  local_25e0 = local_25e0 + 6;
                }
                else {
                  auVar52 = valignd_avx512vl(auVar53,auVar53,3);
                  auVar51 = vmovdqa64_avx512vl(auVar79._0_32_);
                  auVar53 = vpermt2d_avx512vl(auVar51,auVar80._0_32_,auVar12);
                  auVar51 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar54 = vpermt2d_avx512vl(auVar53,auVar51,auVar54);
                  auVar54 = vpermt2d_avx512vl(auVar54,auVar51,auVar55);
                  auVar51 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar50 = vpermt2d_avx512vl(auVar54,auVar51,auVar50);
                  auVar64 = ZEXT3264(auVar50);
                  bVar23 = bVar19;
                  do {
                    auVar51 = auVar64._0_32_;
                    auVar50 = vpermps_avx512vl(auVar72._0_32_,auVar52);
                    auVar52 = valignd_avx512vl(auVar52,auVar52,1);
                    vpermt2q_avx512vl(auVar48,auVar52,auVar49);
                    bVar23 = bVar23 - 1 & bVar23;
                    uVar16 = vpcmpd_avx512vl(auVar50,auVar51,5);
                    auVar50 = vpmaxsd_avx2(auVar50,auVar51);
                    bVar22 = (byte)uVar16 << 1;
                    auVar51 = valignd_avx512vl(auVar51,auVar51,7);
                    bVar11 = (bool)((byte)uVar16 & 1);
                    auVar55._4_4_ = (uint)bVar11 * auVar51._4_4_ | (uint)!bVar11 * auVar50._4_4_;
                    auVar55._0_4_ = auVar50._0_4_;
                    bVar11 = (bool)(bVar22 >> 2 & 1);
                    auVar55._8_4_ = (uint)bVar11 * auVar51._8_4_ | (uint)!bVar11 * auVar50._8_4_;
                    bVar11 = (bool)(bVar22 >> 3 & 1);
                    auVar55._12_4_ = (uint)bVar11 * auVar51._12_4_ | (uint)!bVar11 * auVar50._12_4_;
                    bVar11 = (bool)(bVar22 >> 4 & 1);
                    auVar55._16_4_ = (uint)bVar11 * auVar51._16_4_ | (uint)!bVar11 * auVar50._16_4_;
                    bVar11 = (bool)(bVar22 >> 5 & 1);
                    auVar55._20_4_ = (uint)bVar11 * auVar51._20_4_ | (uint)!bVar11 * auVar50._20_4_;
                    bVar11 = (bool)(bVar22 >> 6 & 1);
                    auVar55._24_4_ = (uint)bVar11 * auVar51._24_4_ | (uint)!bVar11 * auVar50._24_4_;
                    auVar55._28_4_ =
                         (uint)(bVar22 >> 7) * auVar51._28_4_ |
                         (uint)!(bool)(bVar22 >> 7) * auVar50._28_4_;
                    auVar64 = ZEXT3264(auVar55);
                  } while (bVar23 != 0);
                  lVar21 = (ulong)(uint)POPCOUNT((uint)bVar19) + 3;
                  do {
                    auVar50 = vpermi2q_avx512vl(auVar55,auVar48,auVar49);
                    *local_25e0 = auVar50._0_8_;
                    auVar51 = auVar64._0_32_;
                    auVar50 = vpermd_avx2(auVar51,auVar47);
                    *(int *)(local_25e0 + 1) = auVar50._0_4_;
                    auVar55 = valignd_avx512vl(auVar51,auVar51,1);
                    local_25e0 = local_25e0 + 2;
                    auVar64 = ZEXT3264(auVar55);
                    lVar21 = lVar21 + -1;
                  } while (lVar21 != 0);
                  auVar47 = vpermt2q_avx512vl(auVar48,auVar55,auVar49);
                  uVar26 = auVar47._0_8_;
                }
              }
            }
          }
        }
        local_25b0 = (ulong)((uint)uVar26 & 0xf) - 8;
        if (local_25b0 != 0) {
          uVar26 = uVar26 & 0xfffffffffffffff0;
          local_25c0 = local_25c8->scene;
          local_25d0 = 0;
          do {
            lVar21 = local_25d0 * 0x50;
            ppfVar5 = (local_25c0->vertices).items;
            pfVar6 = ppfVar5[*(uint *)(uVar26 + 0x30 + lVar21)];
            pfVar7 = ppfVar5[*(uint *)(uVar26 + 0x34 + lVar21)];
            pfVar8 = ppfVar5[*(uint *)(uVar26 + 0x38 + lVar21)];
            pfVar9 = ppfVar5[*(uint *)(uVar26 + 0x3c + lVar21)];
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + lVar21)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 8 + lVar21)))
            ;
            auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar26 + lVar21)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar26 + 8 + lVar21)))
            ;
            auVar31 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 4 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0xc + lVar21)));
            auVar44 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar26 + 4 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0xc + lVar21)));
            auVar38 = vunpcklps_avx(auVar32,auVar44);
            auVar36 = vunpcklps_avx(auVar30,auVar31);
            auVar37 = vunpckhps_avx(auVar30,auVar31);
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar26 + 0x10 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar26 + 0x18 + lVar21)));
            auVar32 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar26 + 0x10 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar26 + 0x18 + lVar21)));
            auVar31 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar26 + 0x14 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0x1c + lVar21)));
            auVar44 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar26 + 0x14 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0x1c + lVar21)));
            auVar42 = vunpcklps_avx(auVar32,auVar44);
            auVar35 = vunpcklps_avx(auVar30,auVar31);
            auVar44 = vunpckhps_avx(auVar30,auVar31);
            auVar31 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar26 + 0x20 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar26 + 0x28 + lVar21)));
            auVar32 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar26 + 0x20 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar26 + 0x28 + lVar21)));
            auVar43 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar26 + 0x24 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0x2c + lVar21)));
            auVar30 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar26 + 0x24 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar26 + 0x2c + lVar21)));
            auVar33 = vunpcklps_avx(auVar32,auVar30);
            auVar34 = vunpcklps_avx(auVar31,auVar43);
            puVar1 = (undefined8 *)(uVar26 + 0x30 + lVar21);
            local_2468 = *puVar1;
            uStack_2460 = puVar1[1];
            auVar43 = vunpckhps_avx(auVar31,auVar43);
            puVar1 = (undefined8 *)(uVar26 + 0x40 + lVar21);
            local_2528 = *puVar1;
            uStack_2520 = puVar1[1];
            auVar32 = vsubps_avx(auVar36,auVar35);
            auVar44 = vsubps_avx(auVar37,auVar44);
            auVar30 = vsubps_avx(auVar38,auVar42);
            auVar31 = vsubps_avx(auVar34,auVar36);
            auVar43 = vsubps_avx(auVar43,auVar37);
            auVar42 = vsubps_avx(auVar33,auVar38);
            auVar34._0_4_ = auVar44._0_4_ * auVar42._0_4_;
            auVar34._4_4_ = auVar44._4_4_ * auVar42._4_4_;
            auVar34._8_4_ = auVar44._8_4_ * auVar42._8_4_;
            auVar34._12_4_ = auVar44._12_4_ * auVar42._12_4_;
            local_2498 = vfmsub231ps_fma(auVar34,auVar43,auVar30);
            auVar39._0_4_ = auVar30._0_4_ * auVar31._0_4_;
            auVar39._4_4_ = auVar30._4_4_ * auVar31._4_4_;
            auVar39._8_4_ = auVar30._8_4_ * auVar31._8_4_;
            auVar39._12_4_ = auVar30._12_4_ * auVar31._12_4_;
            local_2488 = vfmsub231ps_fma(auVar39,auVar42,auVar32);
            auVar40._0_4_ = auVar32._0_4_ * auVar43._0_4_;
            auVar40._4_4_ = auVar32._4_4_ * auVar43._4_4_;
            auVar40._8_4_ = auVar32._8_4_ * auVar43._8_4_;
            auVar40._12_4_ = auVar32._12_4_ * auVar43._12_4_;
            uVar60 = *(undefined4 *)&(local_25d8->super_RayK<1>).dir.field_0;
            auVar68._4_4_ = uVar60;
            auVar68._0_4_ = uVar60;
            auVar68._8_4_ = uVar60;
            auVar68._12_4_ = uVar60;
            auVar33 = vbroadcastss_avx512vl
                                (ZEXT416((uint)(local_25d8->super_RayK<1>).dir.field_0.m128[1]));
            auVar34 = vbroadcastss_avx512vl
                                (ZEXT416((uint)(local_25d8->super_RayK<1>).dir.field_0.m128[2]));
            uVar60 = *(undefined4 *)&(local_25d8->super_RayK<1>).org.field_0;
            auVar35._4_4_ = uVar60;
            auVar35._0_4_ = uVar60;
            auVar35._8_4_ = uVar60;
            auVar35._12_4_ = uVar60;
            auVar35 = vsubps_avx512vl(auVar36,auVar35);
            local_2478 = vfmsub231ps_fma(auVar40,auVar31,auVar44);
            uVar60 = *(undefined4 *)((long)&(local_25d8->super_RayK<1>).org.field_0 + 4);
            auVar36._4_4_ = uVar60;
            auVar36._0_4_ = uVar60;
            auVar36._8_4_ = uVar60;
            auVar36._12_4_ = uVar60;
            auVar36 = vsubps_avx512vl(auVar37,auVar36);
            uVar60 = *(undefined4 *)((long)&(local_25d8->super_RayK<1>).org.field_0 + 8);
            auVar37._4_4_ = uVar60;
            auVar37._0_4_ = uVar60;
            auVar37._8_4_ = uVar60;
            auVar37._12_4_ = uVar60;
            auVar37 = vsubps_avx512vl(auVar38,auVar37);
            auVar38 = vmulps_avx512vl(auVar33,auVar37);
            auVar39 = vfmsub231ps_avx512vl(auVar38,auVar36,auVar34);
            auVar38 = vmulps_avx512vl(auVar34,auVar35);
            auVar40 = vfmsub231ps_avx512vl(auVar38,auVar37,auVar68);
            auVar38 = vmulps_avx512vl(auVar68,auVar36);
            auVar41 = vfmsub231ps_avx512vl(auVar38,auVar35,auVar33);
            auVar38 = vmulps_avx512vl(local_2478,auVar34);
            auVar38 = vfmadd231ps_avx512vl(auVar38,local_2488,auVar33);
            auVar34 = vfmadd231ps_avx512vl(auVar38,local_2498,auVar68);
            auVar38._8_4_ = 0x7fffffff;
            auVar38._0_8_ = 0x7fffffff7fffffff;
            auVar38._12_4_ = 0x7fffffff;
            local_24e8 = vandps_avx512vl(auVar34,auVar38);
            auVar42 = vmulps_avx512vl(auVar42,auVar41);
            auVar43 = vfmadd231ps_avx512vl(auVar42,auVar40,auVar43);
            auVar31 = vfmadd231ps_fma(auVar43,auVar39,auVar31);
            auVar33._8_4_ = 0x80000000;
            auVar33._0_8_ = 0x8000000080000000;
            auVar33._12_4_ = 0x80000000;
            auVar43 = vandpd_avx512vl(auVar34,auVar33);
            uVar20 = auVar43._0_4_;
            local_2518._0_4_ = (float)(uVar20 ^ auVar31._0_4_);
            uVar66 = auVar43._4_4_;
            local_2518._4_4_ = (float)(uVar66 ^ auVar31._4_4_);
            uVar24 = auVar43._8_4_;
            local_2518._8_4_ = (float)(uVar24 ^ auVar31._8_4_);
            uVar67 = auVar43._12_4_;
            local_2518._12_4_ = (float)(uVar67 ^ auVar31._12_4_);
            auVar30 = vmulps_avx512vl(auVar30,auVar41);
            auVar44 = vfmadd231ps_avx512vl(auVar30,auVar44,auVar40);
            auVar32 = vfmadd231ps_fma(auVar44,auVar32,auVar39);
            local_2508._0_4_ = (float)(uVar20 ^ auVar32._0_4_);
            local_2508._4_4_ = (float)(uVar66 ^ auVar32._4_4_);
            local_2508._8_4_ = (float)(uVar24 ^ auVar32._8_4_);
            local_2508._12_4_ = (float)(uVar67 ^ auVar32._12_4_);
            auVar32 = ZEXT816(0) << 0x20;
            uVar16 = vcmpps_avx512vl(local_2518,auVar32,5);
            uVar13 = vcmpps_avx512vl(local_2508,auVar32,5);
            uVar14 = vcmpps_avx512vl(auVar34,auVar32,4);
            auVar32._0_4_ = local_2518._0_4_ + local_2508._0_4_;
            auVar32._4_4_ = local_2518._4_4_ + local_2508._4_4_;
            auVar32._8_4_ = local_2518._8_4_ + local_2508._8_4_;
            auVar32._12_4_ = local_2518._12_4_ + local_2508._12_4_;
            uVar15 = vcmpps_avx512vl(auVar32,local_24e8,2);
            bVar19 = (byte)uVar16 & (byte)uVar13 & (byte)uVar14 & (byte)uVar15;
            if (bVar19 != 0) {
              auVar65._0_4_ = auVar37._0_4_ * local_2478._0_4_;
              auVar65._4_4_ = auVar37._4_4_ * local_2478._4_4_;
              auVar65._8_4_ = auVar37._8_4_ * local_2478._8_4_;
              auVar65._12_4_ = auVar37._12_4_ * local_2478._12_4_;
              auVar32 = vfmadd213ps_fma(auVar36,local_2488,auVar65);
              auVar32 = vfmadd213ps_fma(auVar35,local_2498,auVar32);
              local_24f8._0_4_ = (float)(uVar20 ^ auVar32._0_4_);
              local_24f8._4_4_ = (float)(uVar66 ^ auVar32._4_4_);
              local_24f8._8_4_ = (float)(uVar24 ^ auVar32._8_4_);
              local_24f8._12_4_ = (float)(uVar67 ^ auVar32._12_4_);
              uVar60 = *(undefined4 *)((long)&(local_25d8->super_RayK<1>).org.field_0 + 0xc);
              auVar44._4_4_ = uVar60;
              auVar44._0_4_ = uVar60;
              auVar44._8_4_ = uVar60;
              auVar44._12_4_ = uVar60;
              auVar32 = vmulps_avx512vl(local_24e8,auVar44);
              fVar56 = (local_25d8->super_RayK<1>).tfar;
              auVar41._4_4_ = fVar56;
              auVar41._0_4_ = fVar56;
              auVar41._8_4_ = fVar56;
              auVar41._12_4_ = fVar56;
              auVar44 = vmulps_avx512vl(local_24e8,auVar41);
              uVar16 = vcmpps_avx512vl(local_24f8,auVar44,2);
              uVar13 = vcmpps_avx512vl(auVar32,local_24f8,1);
              bVar19 = (byte)uVar16 & (byte)uVar13 & bVar19;
              if (bVar19 != 0) {
                auVar3._0_4_ = (local_25d8->super_RayK<1>).tfar;
                auVar3._4_4_ = (local_25d8->super_RayK<1>).mask;
                auVar3._8_4_ = (local_25d8->super_RayK<1>).id;
                auVar3._12_4_ = (local_25d8->super_RayK<1>).flags;
                auVar64 = ZEXT1664(auVar3);
                uVar20 = vextractps_avx(auVar3,1);
                local_24d7 = bVar19;
                auVar32 = vrcp14ps_avx512vl(local_24e8);
                auVar17._8_4_ = 0x3f800000;
                auVar17._0_8_ = 0x3f8000003f800000;
                auVar17._12_4_ = 0x3f800000;
                auVar44 = vfnmadd213ps_avx512vl(local_24e8,auVar32,auVar17);
                auVar32 = vfmadd132ps_fma(auVar44,auVar32,auVar32);
                fVar56 = auVar32._0_4_;
                local_24a8._0_4_ = fVar56 * local_24f8._0_4_;
                fVar61 = auVar32._4_4_;
                local_24a8._4_4_ = fVar61 * local_24f8._4_4_;
                fVar62 = auVar32._8_4_;
                local_24a8._8_4_ = fVar62 * local_24f8._8_4_;
                fVar63 = auVar32._12_4_;
                local_24a8._12_4_ = fVar63 * local_24f8._12_4_;
                auVar59 = ZEXT1664(local_24a8);
                local_24c8[0] = fVar56 * local_2518._0_4_;
                local_24c8[1] = fVar61 * local_2518._4_4_;
                local_24c8[2] = fVar62 * local_2518._8_4_;
                local_24c8[3] = fVar63 * local_2518._12_4_;
                local_24b8[0] = fVar56 * local_2508._0_4_;
                local_24b8[1] = fVar61 * local_2508._4_4_;
                local_24b8[2] = fVar62 * local_2508._8_4_;
                local_24b8[3] = fVar63 * local_2508._12_4_;
                auVar57._8_4_ = 0x7f800000;
                auVar57._0_8_ = 0x7f8000007f800000;
                auVar57._12_4_ = 0x7f800000;
                auVar32 = vblendmps_avx512vl(auVar57,local_24a8);
                auVar45._0_4_ =
                     (uint)(bVar19 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar19 & 1) * 0x7f800000;
                bVar11 = (bool)(bVar19 >> 1 & 1);
                auVar45._4_4_ = (uint)bVar11 * auVar32._4_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)(bVar19 >> 2 & 1);
                auVar45._8_4_ = (uint)bVar11 * auVar32._8_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)(bVar19 >> 3 & 1);
                auVar45._12_4_ = (uint)bVar11 * auVar32._12_4_ | (uint)!bVar11 * 0x7f800000;
                auVar32 = vshufps_avx(auVar45,auVar45,0xb1);
                auVar32 = vminps_avx(auVar32,auVar45);
                auVar44 = vshufpd_avx(auVar32,auVar32,1);
                auVar32 = vminps_avx(auVar44,auVar32);
                uVar16 = vcmpps_avx512vl(auVar45,auVar32,0);
                bVar23 = (byte)uVar16 & bVar19;
                do {
                  local_2548 = auVar64._0_16_;
                  local_2538 = auVar59._0_16_;
                  bVar22 = bVar19;
                  if (bVar23 != 0) {
                    bVar22 = bVar23;
                  }
                  uVar66 = 0;
                  for (uVar24 = (uint)bVar22; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000)
                  {
                    uVar66 = uVar66 + 1;
                  }
                  local_2560 = *(uint *)((long)&local_2468 + (ulong)uVar66 * 4);
                  local_25b8 = (local_25c0->geometries).items[local_2560].ptr;
                  if ((local_25b8->mask & uVar20) == 0) {
                    bVar19 = ~(byte)(1 << (uVar66 & 0x1f)) & bVar19;
                  }
                  else {
                    pRVar10 = local_25c8->args;
                    local_2458 = auVar76._0_32_;
                    local_2438 = auVar75._0_32_;
                    local_2418 = auVar74._0_32_;
                    local_23f8 = auVar73._0_32_;
                    local_23d8 = auVar71._0_32_;
                    local_23b8 = auVar70._0_32_;
                    local_2398 = auVar69._0_32_;
                    if (pRVar10->filter == (RTCFilterFunctionN)0x0) {
                      local_25a8.context = local_25c8->user;
                      if (local_25b8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar25 = (ulong)(uVar66 << 2);
                        fVar56 = *(float *)((long)local_24c8 + uVar25);
                        fVar61 = *(float *)((long)local_24b8 + uVar25);
                        (local_25d8->super_RayK<1>).tfar = *(float *)(local_24a8 + uVar25);
                        (local_25d8->Ng).field_0.field_0.x = *(float *)(local_2498 + uVar25);
                        (local_25d8->Ng).field_0.field_0.y = *(float *)(local_2488 + uVar25);
                        (local_25d8->Ng).field_0.field_0.z = *(float *)(local_2478 + uVar25);
                        local_25d8->u = fVar56;
                        local_25d8->v = fVar61;
                        local_25d8->primID = *(uint *)((long)&local_2528 + uVar25);
                        local_25d8->geomID = local_2560;
                        local_25d8->instID[0] = (local_25a8.context)->instID[0];
                        local_25d8->instPrimID[0] = (local_25a8.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_25a8.context = local_25c8->user;
                    }
                    uVar25 = (ulong)(uVar66 * 4);
                    local_2578 = *(float *)(local_2498 + uVar25);
                    local_2574 = *(undefined4 *)(local_2488 + uVar25);
                    local_2570 = *(undefined4 *)(local_2478 + uVar25);
                    local_256c = *(undefined4 *)((long)local_24c8 + uVar25);
                    local_2568 = *(undefined4 *)((long)local_24b8 + uVar25);
                    local_2564 = *(undefined4 *)((long)&local_2528 + uVar25);
                    local_255c = (local_25a8.context)->instID[0];
                    local_2558 = (local_25a8.context)->instPrimID[0];
                    (local_25d8->super_RayK<1>).tfar = *(float *)(local_24a8 + uVar25);
                    local_25ec = -1;
                    local_25a8.valid = &local_25ec;
                    local_25a8.geometryUserPtr = local_25b8->userPtr;
                    local_25a8.ray = (RTCRayN *)local_25d8;
                    local_25a8.hit = (RTCHitN *)&local_2578;
                    local_25a8.N = 1;
                    if (((local_25b8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_25b8->intersectionFilterN)(&local_25a8), *local_25a8.valid != 0))
                       && ((pRVar10->filter == (RTCFilterFunctionN)0x0 ||
                           ((((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((local_25b8->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*pRVar10->filter)(&local_25a8), *local_25a8.valid != 0)))))) {
                      (((Vec3f *)((long)local_25a8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25a8.hit;
                      (((Vec3f *)((long)local_25a8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25a8.hit + 4);
                      (((Vec3f *)((long)local_25a8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25a8.hit + 8);
                      *(float *)((long)local_25a8.ray + 0x3c) = *(float *)(local_25a8.hit + 0xc);
                      *(float *)((long)local_25a8.ray + 0x40) = *(float *)(local_25a8.hit + 0x10);
                      *(float *)((long)local_25a8.ray + 0x44) = *(float *)(local_25a8.hit + 0x14);
                      *(float *)((long)local_25a8.ray + 0x48) = *(float *)(local_25a8.hit + 0x18);
                      *(float *)((long)local_25a8.ray + 0x4c) = *(float *)(local_25a8.hit + 0x1c);
                      *(float *)((long)local_25a8.ray + 0x50) = *(float *)(local_25a8.hit + 0x20);
                    }
                    else {
                      (local_25d8->super_RayK<1>).tfar = (float)local_2548._0_4_;
                    }
                    auVar4._0_4_ = (local_25d8->super_RayK<1>).tfar;
                    auVar4._4_4_ = (local_25d8->super_RayK<1>).mask;
                    auVar4._8_4_ = (local_25d8->super_RayK<1>).id;
                    auVar4._12_4_ = (local_25d8->super_RayK<1>).flags;
                    auVar64 = ZEXT1664(auVar4);
                    auVar59 = ZEXT1664(local_2538);
                    fVar56 = (local_25d8->super_RayK<1>).tfar;
                    auVar18._4_4_ = fVar56;
                    auVar18._0_4_ = fVar56;
                    auVar18._8_4_ = fVar56;
                    auVar18._12_4_ = fVar56;
                    uVar16 = vcmpps_avx512vl(local_2538,auVar18,2);
                    bVar19 = ~(byte)(1 << (uVar66 & 0x1f)) & bVar19 & (byte)uVar16;
                    uVar20 = vextractps_avx(auVar4,1);
                    auVar69 = ZEXT3264(local_2398);
                    auVar70 = ZEXT3264(local_23b8);
                    auVar71 = ZEXT3264(local_23d8);
                    auVar47 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar72 = ZEXT3264(auVar47);
                    auVar73 = ZEXT3264(local_23f8);
                    auVar74 = ZEXT3264(local_2418);
                    auVar75 = ZEXT3264(local_2438);
                    auVar76 = ZEXT3264(local_2458);
                    auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar77 = ZEXT3264(auVar47);
                    auVar47 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar78 = ZEXT3264(auVar47);
                    auVar32 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar79 = ZEXT1664(auVar32);
                    auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar80 = ZEXT3264(auVar47);
                  }
                  if (bVar19 == 0) break;
                  auVar58._8_4_ = 0x7f800000;
                  auVar58._0_8_ = 0x7f8000007f800000;
                  auVar58._12_4_ = 0x7f800000;
                  auVar32 = vblendmps_avx512vl(auVar58,auVar59._0_16_);
                  auVar46._0_4_ =
                       (uint)(bVar19 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar19 & 1) * 0x7f800000;
                  bVar11 = (bool)(bVar19 >> 1 & 1);
                  auVar46._4_4_ = (uint)bVar11 * auVar32._4_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)(bVar19 >> 2 & 1);
                  auVar46._8_4_ = (uint)bVar11 * auVar32._8_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)(bVar19 >> 3 & 1);
                  auVar46._12_4_ = (uint)bVar11 * auVar32._12_4_ | (uint)!bVar11 * 0x7f800000;
                  auVar32 = vshufps_avx(auVar46,auVar46,0xb1);
                  auVar32 = vminps_avx(auVar32,auVar46);
                  auVar44 = vshufpd_avx(auVar32,auVar32,1);
                  auVar32 = vminps_avx(auVar44,auVar32);
                  uVar16 = vcmpps_avx512vl(auVar46,auVar32,0);
                  bVar23 = (byte)uVar16 & bVar19;
                } while( true );
              }
            }
            local_25d0 = local_25d0 + 1;
          } while (local_25d0 != local_25b0);
        }
        fVar56 = (local_25d8->super_RayK<1>).tfar;
        auVar59 = ZEXT3264(CONCAT428(fVar56,CONCAT424(fVar56,CONCAT420(fVar56,CONCAT416(fVar56,
                                                  CONCAT412(fVar56,CONCAT48(fVar56,CONCAT44(fVar56,
                                                  fVar56))))))));
      }
LAB_01f18b7d:
    } while (local_25e0 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }